

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  qpTestLog *pqVar3;
  _Rb_tree_node_base *p_Var4;
  ostringstream *poVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar10;
  pointer pcVar11;
  double dVar12;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  *pBVar13;
  pointer pMVar14;
  int iVar15;
  _Rb_tree_node_base *p_Var16;
  Interval *pIVar17;
  IVal *pIVar18;
  MessageBuilder *pMVar19;
  undefined8 *puVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  char *pcVar24;
  qpTestLog *pqVar25;
  TestLog TVar26;
  TestLog *pTVar27;
  long lVar28;
  FloatFormat *pFVar29;
  bool bVar30;
  IVal reference1;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  void *outputArr [2];
  IVal in0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  FloatFormat highpFmt;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa88;
  IVal local_571;
  string local_570;
  TestLog *local_550;
  size_t local_548;
  IVal *local_540;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  *local_538;
  TestStatus *local_530;
  FloatFormat *local_528;
  undefined1 local_520 [16];
  TestLog local_510;
  _Rb_tree_node_base *local_508;
  _Rb_tree_node_base *local_500;
  double local_4f8;
  string local_4c0;
  long local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  local_468;
  pointer local_438;
  pointer local_430;
  undefined1 local_428 [20];
  YesNoMaybe YStack_414;
  Interval IStack_410;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3f8;
  Interval local_3f0 [2];
  ios_base local_3b8 [8];
  ios_base local_3b0 [264];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_2a8;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  pointer local_230;
  FloatFormat local_228;
  ResultCollector local_1f8;
  Matrix<tcu::Interval,_2,_2> local_1a8;
  ios_base local_138 [264];
  
  this_00 = this->m_samplings;
  pFVar29 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_530 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_528 = pFVar29;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_2a8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar29,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar15 + 0xdeadbeef),
             in_stack_fffffffffffffa88);
  pMVar14 = local_2a8.in0.
            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_548 = (long)local_2a8.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_2a8.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_468,local_548);
  local_228.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_228.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_228.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_228.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_228.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_228.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_228.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_228.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_228._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_550 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_248 = local_2a8.in0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_240 = local_2a8.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_238 = local_2a8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_230 = local_2a8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_438 = local_468.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_430 = local_468.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_428 + 8);
  local_428._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_3b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_520 + 8);
  local_520._8_4_ = _S_red;
  local_510.m_log = (qpTestLog *)0x0;
  local_4f8 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_508 = p_Var4;
  local_500 = p_Var4;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_520);
  if (local_508 != p_Var4) {
    p_Var16 = local_508;
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),&local_1a8);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var4);
  }
  if (local_4f8 != 0.0) {
    poVar5 = (ostringstream *)(local_428 + 8);
    local_428._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,local_570._M_dataplus._M_p,local_570._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3b0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_520);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pIVar18 = (IVal *)&local_438;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_548,&local_248,pIVar18,0);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_428);
  pFVar29 = local_528;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(&local_1a8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_428);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_520);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_570);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_571);
  if (local_2a8.in0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar14) {
    local_540 = (IVal *)0x0;
  }
  else {
    local_4a0 = local_548 + (local_548 == 0);
    lVar28 = 0;
    local_540 = (IVal *)0x0;
    local_538 = this;
    do {
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix(&local_1a8);
      round<tcu::Matrix<float,2,2>>
                ((IVal *)local_520,(shaderexecutor *)pFVar29,
                 (FloatFormat *)
                 (local_2a8.in0.
                  super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar28),(Matrix<float,_2,_2> *)pIVar18
                );
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_428,pFVar29,(IVal *)local_520);
      pIVar17 = (Interval *)
                Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_498,
                           (local_538->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      pBVar13 = local_538;
      pMVar19 = (MessageBuilder *)local_428;
      lVar22 = 0;
      do {
        lVar23 = 0;
        do {
          *(undefined8 *)((long)&pIVar17->m_hi + lVar23) =
               *(undefined8 *)(&pMVar19->field_0x10 + lVar23);
          puVar20 = (undefined8 *)((long)&pMVar19->m_log + lVar23);
          dVar12 = (double)puVar20[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar17->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar23;
          *(undefined8 *)pbVar2 = *puVar20;
          *(double *)(pbVar2 + 8) = dVar12;
          lVar23 = lVar23 + 0x30;
        } while (lVar23 == 0x30);
        pIVar17 = pIVar17 + 1;
        pMVar19 = (MessageBuilder *)&pMVar19->field_0x18;
        bVar30 = lVar22 == 0;
        lVar22 = lVar22 + 1;
      } while (bVar30);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (local_538->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar13->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar13->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      IStack_410.m_hi._0_4_ = (pBVar13->m_caseCtx).precision;
      IStack_410.m_lo = pFVar29->m_maxValue;
      local_428._0_8_ = *(undefined8 *)pFVar29;
      local_428._8_4_ = pFVar29->m_fractionBits;
      local_428._12_4_ = pFVar29->m_hasSubnormal;
      local_428._16_4_ = pFVar29->m_hasInf;
      YStack_414 = pFVar29->m_hasNaN;
      IStack_410.m_hasNaN = pFVar29->m_exactPrecision;
      IStack_410._1_3_ = *(undefined3 *)&pFVar29->field_0x19;
      IStack_410._4_4_ = *(undefined4 *)&pFVar29->field_0x1c;
      local_3f0[0].m_hasNaN = false;
      local_3f0[0]._1_3_ = 0;
      pSVar8 = (pBVar13->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_3f8 = &local_498;
      (*pSVar8->_vptr_Statement[3])(pSVar8,(MessageBuilder *)local_428);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_498,
                           (pBVar13->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_428,&local_228,pIVar18);
      pIVar17 = (Interval *)&local_1a8;
      poVar5 = (ostringstream *)(local_428 + 8);
      pMVar19 = (MessageBuilder *)local_428;
      lVar22 = 0;
      do {
        lVar23 = 0;
        do {
          *(undefined8 *)((long)&pIVar17->m_hi + lVar23) =
               *(undefined8 *)(&pMVar19->field_0x10 + lVar23);
          puVar20 = (undefined8 *)((long)&pMVar19->m_log + lVar23);
          dVar12 = (double)puVar20[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar17->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar23;
          *(undefined8 *)pbVar2 = *puVar20;
          *(double *)(pbVar2 + 8) = dVar12;
          lVar23 = lVar23 + 0x30;
        } while (lVar23 == 0x30);
        pIVar17 = pIVar17 + 1;
        pMVar19 = (MessageBuilder *)&pMVar19->field_0x18;
        bVar30 = lVar22 == 0;
        lVar22 = lVar22 + 1;
      } while (bVar30);
      bVar30 = contains<tcu::Matrix<float,2,2>>
                         (&local_1a8,
                          local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar28);
      local_428._0_8_ = local_428 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_428,"Shader output 0 is outside acceptable range","");
      bVar30 = tcu::ResultCollector::check(&local_1f8,bVar30,(string *)local_428);
      if ((TestLog *)local_428._0_8_ != (TestLog *)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,CONCAT44(YStack_414,local_428._16_4_) + 1);
      }
      uVar21 = (int)local_540 + ((byte)~bVar30 & 1);
      pIVar18 = (IVal *)(ulong)uVar21;
      local_540 = pIVar18;
      if ((int)uVar21 < 0x65 && !bVar30) {
        local_428._0_8_ = local_550;
        std::__cxx11::ostringstream::ostringstream(poVar5);
        pcVar24 = "Failed";
        if (bVar30) {
          pcVar24 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,pcVar24,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar10 = (local_538->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_520._0_8_ = &local_510;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_520._0_8_,
                   CONCAT44(local_520._12_4_,local_520._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_570,(shaderexecutor *)&local_228,
                   (FloatFormat *)
                   (local_2a8.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),
                   (Matrix<float,_2,_2> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_570._M_dataplus._M_p,local_570._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_520._0_8_ != &local_510) {
          operator_delete((void *)local_520._0_8_,(ulong)((long)&(local_510.m_log)->flags + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar10 = (local_538->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_520._0_8_ = &local_510;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_520._0_8_,
                   CONCAT44(local_520._12_4_,local_520._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_570,(shaderexecutor *)&local_228,
                   (FloatFormat *)
                   (local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),
                   (Matrix<float,_2,_2> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_570._M_dataplus._M_p,local_570._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_4c0,(shaderexecutor *)&local_228,(FloatFormat *)&local_1a8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_520._0_8_ != &local_510) {
          operator_delete((void *)local_520._0_8_,(ulong)((long)&(local_510.m_log)->flags + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_3b0);
      }
      lVar28 = lVar28 + 1;
      pFVar29 = local_528;
    } while (lVar28 != local_4a0);
  }
  iVar15 = (int)local_540;
  if (100 < iVar15) {
    poVar5 = (ostringstream *)(local_428 + 8);
    local_428._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
    std::ostream::operator<<(poVar5,iVar15 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3b0);
  }
  poVar5 = (ostringstream *)(local_428 + 8);
  if (iVar15 == 0) {
    local_428._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_428._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_3b0);
  if (iVar15 == 0) {
    local_428._0_8_ = (TestLog *)(local_428 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Pass","");
    local_530->m_code = QP_TEST_RESULT_PASS;
    (local_530->m_description)._M_dataplus._M_p = (pointer)&(local_530->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_530->m_description,local_428._0_8_,
               (long)(qpTestLog **)local_428._0_8_ + CONCAT44(local_428._12_4_,local_428._8_4_));
    if ((TestLog *)local_428._0_8_ == (TestLog *)(local_428 + 0x10)) goto LAB_009a1e84;
    TVar26.m_log = (qpTestLog *)CONCAT44(YStack_414,local_428._16_4_);
    pTVar27 = (TestLog *)local_428._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
    std::ostream::operator<<(local_428,iVar15);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
    std::ios_base::~ios_base(local_3b8);
    pTVar27 = (TestLog *)(local_428 + 0x10);
    local_428._0_8_ = pTVar27;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428," test failed. Check log for the details","");
    pqVar3 = (qpTestLog *)
             (CONCAT44(local_428._12_4_,local_428._8_4_) +
             CONCAT44(local_520._12_4_,local_520._8_4_));
    TVar26.m_log = (qpTestLog *)0xf;
    if ((TestLog *)local_520._0_8_ != &local_510) {
      TVar26.m_log = local_510.m_log;
    }
    if (TVar26.m_log < pqVar3) {
      pqVar25 = (qpTestLog *)0xf;
      if ((TestLog *)local_428._0_8_ != pTVar27) {
        pqVar25 = (qpTestLog *)CONCAT44(YStack_414,local_428._16_4_);
      }
      if (pqVar25 < pqVar3) goto LAB_009a1d11;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_428,0,(char *)0x0,local_520._0_8_);
    }
    else {
LAB_009a1d11:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_520,local_428._0_8_);
    }
    local_1a8.m_data.m_data[0].m_data[0]._0_8_ = &local_1a8.m_data.m_data[0].m_data[0].m_hi;
    pdVar1 = (double *)(puVar20 + 2);
    if ((double *)*puVar20 == pdVar1) {
      local_1a8.m_data.m_data[0].m_data[0].m_hi = *pdVar1;
      local_1a8.m_data.m_data[0].m_data[1]._0_4_ = *(undefined4 *)(puVar20 + 3);
      local_1a8.m_data.m_data[0].m_data[1]._4_4_ = *(undefined4 *)((long)puVar20 + 0x1c);
    }
    else {
      local_1a8.m_data.m_data[0].m_data[0].m_hi = *pdVar1;
      local_1a8.m_data.m_data[0].m_data[0]._0_8_ = (double *)*puVar20;
    }
    local_1a8.m_data.m_data[0].m_data[0].m_lo = (double)puVar20[1];
    *puVar20 = pdVar1;
    puVar20[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_530->m_code = QP_TEST_RESULT_FAIL;
    (local_530->m_description)._M_dataplus._M_p = (pointer)&(local_530->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_530->m_description,local_1a8.m_data.m_data[0].m_data[0]._0_8_,
               (undefined1 *)
               ((long)local_1a8.m_data.m_data[0].m_data[0].m_lo +
               local_1a8.m_data.m_data[0].m_data[0]._0_8_));
    if ((double *)local_1a8.m_data.m_data[0].m_data[0]._0_8_ !=
        &local_1a8.m_data.m_data[0].m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data.m_data[0].m_data[0]._0_8_,
                      (long)local_1a8.m_data.m_data[0].m_data[0].m_hi + 1);
    }
    if ((TestLog *)local_428._0_8_ != pTVar27) {
      operator_delete((void *)local_428._0_8_,CONCAT44(YStack_414,local_428._16_4_) + 1);
    }
    TVar26.m_log = local_510.m_log;
    pTVar27 = (TestLog *)local_520._0_8_;
    if ((TestLog *)local_520._0_8_ == &local_510) goto LAB_009a1e84;
  }
  operator_delete(pTVar27,(ulong)((long)&(TVar26.m_log)->flags + 1));
LAB_009a1e84:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_468.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_530;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}